

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btrd.h
# Opt level: O1

IntType IsoSpec::invert(IntType t,RealType p,mt19937 *urng)

{
  long lVar1;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar5 = p / (1.0 - p);
  dVar3 = pow(1.0 - p,(double)t);
  dVar4 = std::
          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (urng);
  dVar4 = (DAT_0012d9c8 - stdunif) * dVar4 + stdunif;
  lVar1 = 0;
  do {
    if (dVar4 <= dVar3) {
      return lVar1;
    }
    lVar1 = lVar1 + 1;
    dVar6 = (((double)(t + 1) * dVar5) / (double)lVar1 - dVar5) * dVar3;
    bVar2 = 2.220446049250313e-16 <= dVar6 || dVar3 <= dVar6;
    dVar7 = dVar3;
    if (bVar2) {
      dVar7 = dVar6;
    }
    dVar4 = dVar4 - dVar3;
    dVar3 = dVar7;
  } while (bVar2);
  return lVar1;
}

Assistant:

IntType invert(IntType t, RealType p, std::mt19937& urng = random_gen)
{
    RealType q = 1 - p;
    RealType s = p / q;
    RealType a = (t + 1) * s;
    RealType r = pow((1 - p), static_cast<RealType>(t));
    RealType u = stdunif(urng);
    IntType x = 0;
    while(u > r) {
        u = u - r;
        ++x;
        RealType r1 = ((a/x) - s) * r;
        // If r gets too small then the round-off error
        // becomes a problem.  At this point, p(i) is
        // decreasing exponentially, so if we just call
        // it 0, it's close enough.  Note that the
        // minimum value of q_n is about 1e-7, so we
        // may need to be a little careful to make sure that
        // we don't terminate the first time through the loop
        // for float.  (Hence the test that r is decreasing)
        if(r1 < std::numeric_limits<RealType>::epsilon() && r1 < r) {
            break;
        }
        r = r1;
    }
    return x;
}